

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O0

streamsize __thiscall
stream::inno_exe_decoder_4108::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_4108 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  long in_RCX;
  undefined1 *in_RDX;
  uint *in_RDI;
  int byte;
  streamsize i;
  streamsize local_48;
  uint local_34;
  long local_30;
  undefined1 *local_20;
  
  local_30 = 0;
  local_20 = in_RDX;
  while( true ) {
    if (in_RCX <= local_30) {
      return in_RCX;
    }
    local_34 = boost::iostreams::
               get<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
                         ((linked_streambuf<char,_std::char_traits<char>_> *)0x1b0ba5);
    if (local_34 == 0xffffffff) break;
    if (local_34 == 0xfffffffe) {
      return local_30;
    }
    if (*(long *)(in_RDI + 2) == 0) {
      if ((local_34 == 0xe8) || (local_34 == 0xe9)) {
        *in_RDI = (in_RDI[4] ^ 0xffffffff) + 1;
        in_RDI[2] = 4;
        in_RDI[3] = 0;
      }
    }
    else {
      *in_RDI = (local_34 & 0xff) + *in_RDI;
      local_34 = *in_RDI & 0xff;
      *in_RDI = *in_RDI >> 8;
      *(long *)(in_RDI + 2) = *(long *)(in_RDI + 2) + -1;
    }
    *local_20 = (char)local_34;
    local_30 = local_30 + 1;
    in_RDI[4] = in_RDI[4] + 1;
    local_20 = local_20 + 1;
  }
  if (local_30 == 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_30;
  }
  return local_48;
}

Assistant:

std::streamsize inno_exe_decoder_4108::read(Source & src, char * dest, std::streamsize n) {
	
	for(std::streamsize i = 0; i < n; i++, addr_offset++) {
		
		int byte = boost::iostreams::get(src);
		if(byte == EOF) { return i ? i : EOF; }
		if(byte == boost::iostreams::WOULD_BLOCK) { return i; }
		
		if(addr_bytes_left == 0) {
			
			// Check if this is a CALL or JMP instruction.
			if(byte == 0xe8 || byte == 0xe9) {
				addr = ~addr_offset + 1;
				addr_bytes_left = 4;
			}
			
		} else {
			addr += boost::uint8_t(byte);
			byte = boost::uint8_t(addr);
			addr >>= 8;
			addr_bytes_left--;
		}
		
		*dest++ = char(boost::uint8_t(byte));
	}
	
	return n;
}